

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

TSMetadataList waitForNextMetadata(SstStream Stream,ssize_t LastTimestep)

{
  SstStream p_Var1;
  __pid_t _Var2;
  pthread_t pVar3;
  long in_RSI;
  SstStream in_RDI;
  TSMetadataList Tmp;
  _TimestepMetadataList *Next;
  TSMetadataList FoundTS;
  TSMetadataMsg in_stack_ffffffffffffffb8;
  SstStream in_stack_ffffffffffffffc0;
  _TimestepMetadataMsg *in_stack_ffffffffffffffc8;
  SstStream in_stack_ffffffffffffffd0;
  SstStream local_28;
  SstStream local_20;
  
  local_20 = (SstStream)0x0;
  CP_verbose(in_RDI,PerRankVerbose,"Wait for next metadata after last timestep %ld\n",in_RSI);
  do {
    local_28 = (SstStream)in_RDI->Timesteps;
    while (local_28 != (SstStream)0x0) {
      CP_verbose(in_RDI,TraceVerbose,"Examining metadata for timestep %ld\n",local_28->CPInfo->ffs_c
                );
      if (((local_28->CPInfo->CombinedReaderInfoFormat == (FFSTypeHandle)0x0) ||
          ((long)local_28->CPInfo->ffs_c < in_RDI->DiscardPriorTimestep)) &&
         (local_20 == (SstStream)0x0)) {
        CP_verbose(in_RDI,PerRankVerbose,
                   "SstAdvanceStep installing precious metadata for discarded TS %ld\n",
                   local_28->CPInfo->ffs_c);
        if (in_RDI->WriterConfigParams->MarshalMethod == 0) {
          FFSMarshalInstallPreciousMetadata(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        }
        else if (in_RDI->WriterConfigParams->MarshalMethod == 2) {
          AddFormatsToMetaMetaInfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          AddAttributesToAttrDataList(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        }
        p_Var1 = (SstStream)local_28->mpiComm;
        FreeTimestep(local_28,(ssize_t)in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffd0 = local_28;
        local_28 = p_Var1;
      }
      else {
        if (in_RSI <= (long)local_28->CPInfo->ffs_c) {
          if ((local_20 == (SstStream)0x0) && (in_RSI < (long)local_28->CPInfo->ffs_c)) {
            local_20 = local_28;
            break;
          }
          if ((local_20 != (SstStream)0x0) &&
             ((long)local_28->CPInfo->ffs_c < (long)local_20->CPInfo->ffs_c)) {
            local_20 = local_28;
            break;
          }
        }
        local_28 = (SstStream)local_28->mpiComm;
      }
    }
    if (local_20 != (SstStream)0x0) {
      CP_verbose(in_RDI,PerRankVerbose,"Returning metadata for timestep %ld\n",
                 local_20->CPInfo->ffs_c);
      in_RDI->CurrentWorkingTimestep = (ssize_t)local_20->CPInfo->ffs_c;
      return (TSMetadataList)local_20;
    }
    if ((in_RDI->Status != Established) ||
       ((in_RDI->FinalTimestep != 0x7fffffffffffffff && (in_RSI <= in_RDI->FinalTimestep)))) {
      CP_verbose(in_RDI,TraceVerbose,"Stream Final Timestep is %ld, last timestep was %ld\n",
                 in_RDI->FinalTimestep,in_RSI);
      if (in_RDI->Status == NotOpen) {
        CP_verbose(in_RDI,PerRankVerbose,
                   "Wait for next metadata returning NULL because channel was never fully established\n"
                  );
      }
      else if (in_RDI->Status == PeerFailed) {
        CP_verbose(in_RDI,PerRankVerbose,
                   "Wait for next metadata returning NULL because the connection failed before final timestep notification\n"
                  );
      }
      else {
        CP_verbose(in_RDI,PerStepVerbose,"Wait for next metadata returning NULL, status %d ",
                   (ulong)in_RDI->Status);
      }
      in_RDI->CurrentWorkingTimestep = -1;
      return (TSMetadataList)0x0;
    }
    CP_verbose(in_RDI,PerRankVerbose,"Waiting for metadata for a Timestep later than TS %ld\n",
               in_RSI);
    in_stack_ffffffffffffffc0 = in_RDI;
    _Var2 = getpid();
    in_stack_ffffffffffffffc8 = (_TimestepMetadataMsg *)(long)_Var2;
    pVar3 = pthread_self();
    CP_verbose(in_stack_ffffffffffffffc0,TraceVerbose,"(PID %lx, TID %lx) Stream status is %s\n",
               in_stack_ffffffffffffffc8,pVar3,SSTStreamStatusStr[in_RDI->Status]);
    pthread_cond_wait((pthread_cond_t *)&in_RDI->DataCondition,(pthread_mutex_t *)&in_RDI->DataLock)
    ;
  } while( true );
}

Assistant:

static TSMetadataList waitForNextMetadata(SstStream Stream, ssize_t LastTimestep)
{
    TSMetadataList FoundTS = NULL;
    CP_verbose(Stream, PerRankVerbose, "Wait for next metadata after last timestep %ld\n",
               LastTimestep);
    while (1)
    {
        struct _TimestepMetadataList *Next;
        Next = Stream->Timesteps;
        while (Next)
        {
            CP_verbose(Stream, TraceVerbose, "Examining metadata for timestep %ld\n",
                       Next->MetadataMsg->Timestep);
            if (((Next->MetadataMsg->Metadata == NULL) ||
                 (Next->MetadataMsg->Timestep < Stream->DiscardPriorTimestep)) &&
                (FoundTS == NULL))
            {
                /*
                 * Either this is a dummy timestep for something that
                 * was discarded on the writer side, or it is a
                 * timestep that satisfies DiscardPriorTimestep and
                 * we've already sent a release for it.  Now is the
                 * time to install the 'precious' info that it carried
                 * (Attributes and formats) and then discard it.
                 */
                CP_verbose(Stream, PerRankVerbose,
                           "SstAdvanceStep installing precious "
                           "metadata for discarded TS %ld\n",
                           Next->MetadataMsg->Timestep);
                if (Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS)
                {
                    FFSMarshalInstallPreciousMetadata(Stream, Next->MetadataMsg);
                }
                else if (Stream->WriterConfigParams->MarshalMethod == SstMarshalBP5)
                {
                    AddFormatsToMetaMetaInfo(Stream, Next->MetadataMsg);
                    AddAttributesToAttrDataList(Stream, Next->MetadataMsg);
                }
                TSMetadataList Tmp = Next;
                Next = Next->Next;
                FreeTimestep(Stream, Tmp->MetadataMsg->Timestep);
                continue;
            }
            if (Next->MetadataMsg->Timestep >= LastTimestep)
            {
                if ((FoundTS == NULL) && (Next->MetadataMsg->Timestep > LastTimestep))
                {
                    FoundTS = Next;
                    break;
                }
                else if ((FoundTS != NULL) &&
                         (FoundTS->MetadataMsg->Timestep > Next->MetadataMsg->Timestep))
                {
                    FoundTS = Next;
                    break;
                }
            }
            Next = Next->Next;
        }
        if (FoundTS)
        {
            CP_verbose(Stream, PerRankVerbose, "Returning metadata for timestep %ld\n",
                       FoundTS->MetadataMsg->Timestep);
            Stream->CurrentWorkingTimestep = FoundTS->MetadataMsg->Timestep;
            return FoundTS;
        }
        /* didn't find a good next timestep, check Stream status */
        if ((Stream->Status != Established) ||
            ((Stream->FinalTimestep != SSIZE_T_MAX) && (Stream->FinalTimestep >= LastTimestep)))
        {
            CP_verbose(Stream, TraceVerbose,
                       "Stream Final Timestep is %ld, last timestep was %ld\n",
                       Stream->FinalTimestep, LastTimestep);
            if (Stream->Status == NotOpen)
            {
                CP_verbose(Stream, PerRankVerbose,
                           "Wait for next metadata returning NULL because "
                           "channel was never fully established\n");
            }
            else if (Stream->Status == PeerFailed)
            {
                CP_verbose(Stream, PerRankVerbose,
                           "Wait for next metadata returning NULL because "
                           "the connection failed before final timestep "
                           "notification\n");
            }
            else
            {
                CP_verbose(Stream, PerStepVerbose,
                           "Wait for next metadata returning NULL, status %d ", Stream->Status);
            }
            /* closed or failed, return NULL */
            Stream->CurrentWorkingTimestep = -1;
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for metadata for a Timestep later than TS %ld\n", LastTimestep);
        CP_verbose(Stream, TraceVerbose, "(PID %lx, TID %lx) Stream status is %s\n",
                   (unsigned long)getpid(), (unsigned long)gettid(),
                   SSTStreamStatusStr[Stream->Status]);
        /* wait until we get the timestep metadata or something else changes */
        STREAM_CONDITION_WAIT(Stream);
    }
    /* NOTREACHED */
}